

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

ostream * __thiscall
Potassco::AspifTextOutput::printName(AspifTextOutput *this,ostream *os,Lit_t lit)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_RAX;
  string *psVar1;
  ostream *poVar2;
  Atom_t atom;
  Data *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_28;
  
  local_28 = in_RAX;
  if (lit < 0) {
    std::operator<<(os,"not ");
  }
  atom = -lit;
  if (0 < lit) {
    atom = lit;
  }
  psVar1 = Data::getAtomName_abi_cxx11_(this->data_,atom);
  if (psVar1 == (string *)0x0) {
    poVar2 = std::operator<<(os,"x_");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    if (this->showAtoms_ == false) {
      this->showAtoms_ = true;
      this_00 = this->data_;
      if ((this_00->atoms).
          super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this_00->atoms).
          super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_28 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)0x0;
        std::
        vector<std::pair<std::__cxx11::string_const,unsigned_int>*,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>*>>
        ::emplace_back<std::pair<std::__cxx11::string_const,unsigned_int>*>
                  ((vector<std::pair<std::__cxx11::string_const,unsigned_int>*,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>*>>
                    *)&this_00->atoms,&local_28);
        this_00 = this->data_;
      }
      Data::setGenName(this_00,0);
    }
  }
  else {
    std::operator<<(os,(string *)psVar1);
  }
  if (atom < this->maxAtom_) {
    atom = this->maxAtom_;
  }
  this->maxAtom_ = atom;
  return os;
}

Assistant:

std::ostream& AspifTextOutput::printName(std::ostream& os, Lit_t lit) {
	if (lit < 0) { os << "not "; }
	Atom_t id = Potassco::atom(lit);
	if (const std::string* name = data_->getAtomName(id)) {
		os << *name;
	}
	else {
		os << "x_" << id;
		if (!showAtoms_) {
			showAtoms_ = true;
			if (data_->atoms.empty()) { data_->atoms.push_back(0); }
			data_->setGenName(0);
		}
	}
	maxAtom_ = std::max(maxAtom_, id);
	return os;
}